

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong in_RDX;
  ulong uVar4;
  uint in_ESI;
  long in_RDI;
  longlong in_R8;
  longlong in_R9;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i c_07;
  __m128i c_08;
  __m128i c_09;
  __m128i c_10;
  __m128i c_11;
  __m128i c_12;
  __m128i c_13;
  int j_4;
  size_t i_8;
  int j_3;
  size_t i_7;
  int j_2;
  size_t i_6;
  int j_1;
  size_t i_5;
  size_t z;
  size_t i_4;
  size_t i_3;
  size_t thislimit;
  size_t i_2;
  __m128i counter [16];
  uint16_t buffer [8];
  uint64_t i;
  uint64_t limit;
  __m128i eightsB;
  __m128i eightsA;
  __m128i foursB;
  __m128i foursA;
  __m128i twosB;
  __m128i twosA;
  __m128i v16;
  __m128i v8;
  __m128i v4;
  __m128i v2;
  __m128i v1;
  size_t size;
  __m128i *data;
  int j;
  uint32_t i_1;
  int local_c8c;
  ulong local_c88;
  int local_c7c;
  ulong local_c78;
  int local_c6c;
  ulong local_c68;
  int local_c5c;
  ulong local_c58;
  ulong local_c50;
  ulong local_c48;
  ulong local_c40;
  ulong local_c38;
  ulong local_c30;
  undefined1 local_c28 [16];
  undefined1 local_c18 [16];
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [16];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  __m128i local_b28;
  ulong local_b18;
  ulong local_b10;
  longlong local_b08 [2];
  longlong local_af8 [2];
  longlong local_ae8 [2];
  longlong local_ad8 [2];
  longlong local_ac8 [2];
  longlong local_ab8 [2];
  __m128i local_aa8;
  __m128i local_a98;
  longlong local_a88;
  longlong lStack_a80;
  longlong local_a78;
  longlong lStack_a70;
  longlong local_a68;
  longlong lStack_a60;
  ulong local_a50;
  long local_a48;
  int local_a40;
  uint local_a3c;
  ulong local_a38;
  undefined2 local_a1a;
  undefined2 local_a18;
  undefined2 local_a16;
  undefined2 local_a14;
  undefined2 local_a12;
  undefined2 local_a10;
  undefined2 local_a0e;
  undefined2 local_a0c;
  undefined2 local_a0a;
  undefined2 local_a08;
  undefined2 local_a06;
  undefined2 local_a04;
  undefined2 local_a02;
  undefined2 local_a00;
  undefined2 local_9fe;
  undefined2 local_9fc;
  undefined2 local_9fa;
  undefined1 local_9f8 [16];
  undefined2 local_9e8;
  undefined2 local_9e6;
  undefined2 local_9e4;
  undefined2 local_9e2;
  undefined2 local_9e0;
  undefined2 local_9de;
  undefined2 local_9dc;
  undefined2 local_9da;
  undefined1 local_9d8 [16];
  undefined2 local_9c8;
  undefined2 local_9c6;
  undefined2 local_9c4;
  undefined2 local_9c2;
  undefined2 local_9c0;
  undefined2 local_9be;
  undefined2 local_9bc;
  undefined2 local_9ba;
  undefined1 local_9b8 [16];
  undefined2 local_9a8;
  undefined2 local_9a6;
  undefined2 local_9a4;
  undefined2 local_9a2;
  undefined2 local_9a0;
  undefined2 local_99e;
  undefined2 local_99c;
  undefined2 local_99a;
  undefined1 local_998 [16];
  undefined2 local_988;
  undefined2 local_986;
  undefined2 local_984;
  undefined2 local_982;
  undefined2 local_980;
  undefined2 local_97e;
  undefined2 local_97c;
  undefined2 local_97a;
  undefined1 local_978 [16];
  undefined2 local_968;
  undefined2 local_966;
  undefined2 local_964;
  undefined2 local_962;
  undefined2 local_960;
  undefined2 local_95e;
  undefined2 local_95c;
  undefined2 local_95a;
  undefined1 local_958 [16];
  undefined2 local_948;
  undefined2 local_946;
  undefined2 local_944;
  undefined2 local_942;
  undefined2 local_940;
  undefined2 local_93e;
  undefined2 local_93c;
  undefined2 local_93a;
  undefined1 local_938 [16];
  undefined2 local_928;
  undefined2 local_926;
  undefined2 local_924;
  undefined2 local_922;
  undefined2 local_920;
  undefined2 local_91e;
  undefined2 local_91c;
  undefined2 local_91a;
  undefined1 local_918 [16];
  undefined2 local_908;
  undefined2 local_906;
  undefined2 local_904;
  undefined2 local_902;
  undefined2 local_900;
  undefined2 local_8fe;
  undefined2 local_8fc;
  undefined2 local_8fa;
  undefined1 local_8f8 [16];
  undefined2 local_8e8;
  undefined2 local_8e6;
  undefined2 local_8e4;
  undefined2 local_8e2;
  undefined2 local_8e0;
  undefined2 local_8de;
  undefined2 local_8dc;
  undefined2 local_8da;
  undefined1 local_8d8 [16];
  undefined2 local_8c8;
  undefined2 local_8c6;
  undefined2 local_8c4;
  undefined2 local_8c2;
  undefined2 local_8c0;
  undefined2 local_8be;
  undefined2 local_8bc;
  undefined2 local_8ba;
  undefined1 local_8b8 [16];
  undefined2 local_8a8;
  undefined2 local_8a6;
  undefined2 local_8a4;
  undefined2 local_8a2;
  undefined2 local_8a0;
  undefined2 local_89e;
  undefined2 local_89c;
  undefined2 local_89a;
  undefined1 local_898 [16];
  undefined2 local_888;
  undefined2 local_886;
  undefined2 local_884;
  undefined2 local_882;
  undefined2 local_880;
  undefined2 local_87e;
  undefined2 local_87c;
  undefined2 local_87a;
  undefined1 local_878 [16];
  undefined2 local_868;
  undefined2 local_866;
  undefined2 local_864;
  undefined2 local_862;
  undefined2 local_860;
  undefined2 local_85e;
  undefined2 local_85c;
  undefined2 local_85a;
  undefined1 local_858 [16];
  undefined2 local_848;
  undefined2 local_846;
  undefined2 local_844;
  undefined2 local_842;
  undefined2 local_840;
  undefined2 local_83e;
  undefined2 local_83c;
  undefined2 local_83a;
  undefined1 local_838 [16];
  undefined2 local_828;
  undefined2 local_826;
  undefined2 local_824;
  undefined2 local_822;
  undefined2 local_820;
  undefined2 local_81e;
  undefined2 local_81c;
  undefined2 local_81a;
  undefined1 local_818 [16];
  undefined2 local_808;
  undefined2 local_806;
  undefined2 local_804;
  undefined2 local_802;
  undefined2 local_800;
  undefined2 local_7fe;
  undefined2 local_7fc;
  undefined2 local_7fa;
  undefined1 local_7f8 [16];
  undefined2 local_7e8;
  undefined2 local_7e6;
  undefined2 local_7e4;
  undefined2 local_7e2;
  undefined2 local_7e0;
  undefined2 local_7de;
  undefined2 local_7dc;
  undefined2 local_7da;
  undefined1 local_7d8 [16];
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined1 local_7b8 [16];
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined1 local_798 [16];
  undefined8 local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 local_758 [16];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 local_738 [16];
  undefined8 local_728;
  undefined8 uStack_720;
  undefined1 local_718 [16];
  undefined8 local_708;
  undefined8 uStack_700;
  undefined1 local_6f8 [16];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined1 local_6d8 [16];
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined1 local_6b8 [16];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined1 local_698 [16];
  undefined8 local_688;
  undefined8 uStack_680;
  undefined1 local_678 [16];
  undefined8 local_668;
  undefined8 uStack_660;
  undefined1 local_658 [16];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined1 local_638 [16];
  undefined8 local_628;
  undefined8 uStack_620;
  undefined1 local_618 [16];
  undefined8 local_608;
  undefined8 uStack_600;
  undefined1 local_5f8 [16];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8 [16];
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  longlong local_5a8;
  longlong lStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  longlong local_588;
  longlong lStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  longlong local_568;
  longlong lStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  longlong local_548;
  longlong lStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  longlong local_528;
  longlong lStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  longlong local_508;
  longlong lStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  longlong local_4e8;
  longlong lStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  longlong local_4c8;
  longlong lStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  longlong local_4a8;
  longlong lStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  longlong local_488;
  longlong lStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  longlong local_468;
  longlong lStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  longlong local_448;
  longlong lStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  longlong local_428;
  longlong lStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  longlong local_408;
  longlong lStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  longlong local_3a8;
  longlong lStack_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined4 local_2ac;
  longlong local_2a8;
  longlong lStack_2a0;
  undefined4 local_28c;
  longlong local_288;
  longlong lStack_280;
  undefined4 local_26c;
  longlong local_268;
  longlong lStack_260;
  undefined4 local_24c;
  longlong local_248;
  longlong lStack_240;
  undefined4 local_22c;
  longlong local_228;
  longlong lStack_220;
  undefined4 local_20c;
  longlong local_208;
  longlong lStack_200;
  undefined4 local_1ec;
  longlong local_1e8;
  longlong lStack_1e0;
  undefined4 local_1cc;
  longlong local_1c8;
  longlong lStack_1c0;
  undefined4 local_1ac;
  longlong local_1a8;
  longlong lStack_1a0;
  undefined4 local_18c;
  longlong local_188;
  longlong lStack_180;
  undefined4 local_16c;
  longlong local_168;
  longlong lStack_160;
  undefined4 local_14c;
  longlong local_148;
  longlong lStack_140;
  undefined4 local_12c;
  longlong local_128;
  longlong lStack_120;
  undefined4 local_10c;
  longlong local_108;
  longlong lStack_100;
  undefined4 local_ec;
  longlong local_e8;
  longlong lStack_e0;
  undefined4 local_cc;
  longlong local_c8;
  longlong lStack_c0;
  undefined4 local_ac;
  longlong local_a8;
  longlong lStack_a0;
  undefined8 local_18;
  undefined8 uStack_10;
  longlong *local_8;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  longlong extraout_RDX_07;
  longlong extraout_RDX_08;
  longlong extraout_RDX_09;
  longlong extraout_RDX_10;
  longlong extraout_RDX_11;
  longlong extraout_RDX_12;
  ulong extraout_RDX_13;
  
  uVar4 = in_RDX;
  for (local_a3c = in_ESI - (in_ESI & 0x7f); local_a3c < in_ESI; local_a3c = local_a3c + 1) {
    for (local_a40 = 0; local_a40 < 0x10; local_a40 = local_a40 + 1) {
      uVar3 = ((int)((uint)*(ushort *)(in_RDI + (ulong)local_a3c * 2) &
                    1 << ((byte)local_a40 & 0x1f)) >> ((byte)local_a40 & 0x1f)) +
              *(int *)(in_RDX + (long)local_a40 * 4);
      uVar4 = (ulong)uVar3;
      *(uint *)(in_RDX + (long)local_a40 * 4) = uVar3;
    }
  }
  local_a50 = (ulong)(in_ESI >> 3);
  local_2c8 = (undefined1  [16])0x0;
  local_a68 = 0;
  lStack_a60 = 0;
  local_2d8 = (undefined1  [16])0x0;
  local_a78 = 0;
  lStack_a70 = 0;
  local_2e8 = (undefined1  [16])0x0;
  local_a88 = 0;
  lStack_a80 = 0;
  local_2f8 = (undefined1  [16])0x0;
  local_a98[0] = 0;
  local_a98[1] = 0;
  local_308 = (undefined1  [16])0x0;
  local_aa8[0] = 0;
  local_aa8[1] = 0;
  local_b10 = local_a50 - (local_a50 & 0xf);
  local_b18 = 0;
  local_a48 = in_RDI;
  local_a38 = in_RDX;
  while (local_b18 < local_b10) {
    for (local_c30 = 0; local_c30 < 0x10; local_c30 = local_c30 + 1) {
      local_318 = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(local_c28 + local_c30 * 0x10) = (undefined1  [16])0x0;
    }
    local_c38 = local_b10;
    if (0xffff < local_b10 - local_b18) {
      local_c38 = local_b18 + 0xffff;
    }
    for (; local_b18 < local_c38; local_b18 = local_b18 + 0x10) {
      local_320 = local_a48 + local_b18 * 0x10;
      b[1] = local_b18 * 0x10;
      local_328 = local_a48 + 0x10 + b[1];
      b[0] = uVar4;
      c[1] = in_R9;
      c[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a68,b,c);
      local_330 = local_a48 + 0x20 + local_b18 * 0x10;
      b_00[1] = local_b18 * 0x10;
      local_338 = local_a48 + 0x30 + b_00[1];
      b_00[0] = extraout_RDX;
      c_00[1] = in_R9;
      c_00[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a68,b_00,c_00);
      b_01[1] = b_00[1];
      b_01[0] = extraout_RDX_00;
      c_01[1] = in_R9;
      c_01[0] = in_R8;
      pospopcnt_csa_sse(&local_ad8,(__m128i *)&local_a78,b_01,c_01);
      local_340 = local_a48 + 0x40 + local_b18 * 0x10;
      b_02[1] = local_b18 * 0x10;
      local_348 = local_a48 + 0x50 + b_02[1];
      b_02[0] = extraout_RDX_01;
      c_02[1] = in_R9;
      c_02[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a68,b_02,c_02);
      local_350 = local_a48 + 0x60 + local_b18 * 0x10;
      b_03[1] = local_b18 * 0x10;
      local_358 = local_a48 + 0x70 + b_03[1];
      b_03[0] = extraout_RDX_02;
      c_03[1] = in_R9;
      c_03[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a68,b_03,c_03);
      b_04[1] = b_03[1];
      b_04[0] = extraout_RDX_03;
      c_04[1] = in_R9;
      c_04[0] = in_R8;
      pospopcnt_csa_sse(&local_ae8,(__m128i *)&local_a78,b_04,c_04);
      b_05[1] = b_03[1];
      b_05[0] = extraout_RDX_04;
      c_05[1] = in_R9;
      c_05[0] = in_R8;
      pospopcnt_csa_sse(&local_af8,(__m128i *)&local_a88,b_05,c_05);
      local_360 = local_a48 + 0x80 + local_b18 * 0x10;
      b_06[1] = local_b18 * 0x10;
      local_368 = local_a48 + 0x90 + b_06[1];
      b_06[0] = extraout_RDX_05;
      c_06[1] = in_R9;
      c_06[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a68,b_06,c_06);
      local_370 = local_a48 + 0xa0 + local_b18 * 0x10;
      b_07[1] = local_b18 * 0x10;
      local_378 = local_a48 + 0xb0 + b_07[1];
      b_07[0] = extraout_RDX_06;
      c_07[1] = in_R9;
      c_07[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a68,b_07,c_07);
      b_08[1] = b_07[1];
      b_08[0] = extraout_RDX_07;
      c_08[1] = in_R9;
      c_08[0] = in_R8;
      pospopcnt_csa_sse(&local_ad8,(__m128i *)&local_a78,b_08,c_08);
      local_380 = local_a48 + 0xc0 + local_b18 * 0x10;
      b_09[1] = local_b18 * 0x10;
      local_388 = local_a48 + 0xd0 + b_09[1];
      b_09[0] = extraout_RDX_08;
      c_09[1] = in_R9;
      c_09[0] = in_R8;
      pospopcnt_csa_sse(&local_ab8,(__m128i *)&local_a68,b_09,c_09);
      local_390 = local_a48 + 0xe0 + local_b18 * 0x10;
      b_10[1] = local_b18 * 0x10;
      local_398 = local_a48 + 0xf0 + b_10[1];
      b_10[0] = extraout_RDX_09;
      c_10[1] = in_R9;
      c_10[0] = in_R8;
      pospopcnt_csa_sse(&local_ac8,(__m128i *)&local_a68,b_10,c_10);
      b_11[1] = b_10[1];
      b_11[0] = extraout_RDX_10;
      c_11[1] = in_R9;
      c_11[0] = in_R8;
      pospopcnt_csa_sse(&local_ae8,(__m128i *)&local_a78,b_11,c_11);
      b_12[1] = b_10[1];
      b_12[0] = extraout_RDX_11;
      c_12[1] = in_R9;
      c_12[0] = in_R8;
      pospopcnt_csa_sse(&local_b08,(__m128i *)&local_a88,b_12,c_12);
      local_9fa = 1;
      local_9da = 1;
      local_9dc = 1;
      local_9de = 1;
      local_9e0 = 1;
      local_9e2 = 1;
      local_9e4 = 1;
      local_9e6 = 1;
      local_9e8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_9f8 = vpinsrw_avx(auVar1,1,7);
      local_3a8 = local_aa8[0];
      lStack_3a0 = local_aa8[1];
      local_3b8 = local_9f8._0_8_;
      uStack_3b0 = local_9f8._8_8_;
      local_5d8 = vpand_avx((undefined1  [16])local_aa8,local_9f8);
      local_5c8 = local_c28._0_8_;
      uStack_5c0 = local_c28._8_8_;
      local_c28 = vpaddw_avx(local_c28,local_5d8);
      local_a8 = local_aa8[0];
      lStack_a0 = local_aa8[1];
      local_ac = 1;
      auVar2 = vpsrlw_avx((undefined1  [16])local_aa8,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_9fc = 1;
      local_9ba = 1;
      local_9bc = 1;
      local_9be = 1;
      local_9c0 = 1;
      local_9c2 = 1;
      local_9c4 = 1;
      local_9c6 = 1;
      local_9c8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_9d8 = vpinsrw_avx(auVar1,1,7);
      local_3c8 = local_aa8[0];
      lStack_3c0 = local_aa8[1];
      local_3d8 = local_9d8._0_8_;
      uStack_3d0 = local_9d8._8_8_;
      local_5f8 = vpand_avx(auVar2,local_9d8);
      local_5e8 = local_c18._0_8_;
      uStack_5e0 = local_c18._8_8_;
      local_c18 = vpaddw_avx(local_c18,local_5f8);
      local_c8 = local_aa8[0];
      lStack_c0 = local_aa8[1];
      local_cc = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_9fe = 1;
      local_99a = 1;
      local_99c = 1;
      local_99e = 1;
      local_9a0 = 1;
      local_9a2 = 1;
      local_9a4 = 1;
      local_9a6 = 1;
      local_9a8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_9b8 = vpinsrw_avx(auVar1,1,7);
      local_3e8 = local_aa8[0];
      lStack_3e0 = local_aa8[1];
      local_3f8 = local_9b8._0_8_;
      uStack_3f0 = local_9b8._8_8_;
      local_618 = vpand_avx(auVar2,local_9b8);
      local_608 = local_c08._0_8_;
      uStack_600 = local_c08._8_8_;
      local_c08 = vpaddw_avx(local_c08,local_618);
      local_e8 = local_aa8[0];
      lStack_e0 = local_aa8[1];
      local_ec = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a00 = 1;
      local_97a = 1;
      local_97c = 1;
      local_97e = 1;
      local_980 = 1;
      local_982 = 1;
      local_984 = 1;
      local_986 = 1;
      local_988 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_998 = vpinsrw_avx(auVar1,1,7);
      local_408 = local_aa8[0];
      lStack_400 = local_aa8[1];
      local_418 = local_998._0_8_;
      uStack_410 = local_998._8_8_;
      local_638 = vpand_avx(auVar2,local_998);
      local_628 = local_bf8._0_8_;
      uStack_620 = local_bf8._8_8_;
      local_bf8 = vpaddw_avx(local_bf8,local_638);
      local_108 = local_aa8[0];
      lStack_100 = local_aa8[1];
      local_10c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a02 = 1;
      local_95a = 1;
      local_95c = 1;
      local_95e = 1;
      local_960 = 1;
      local_962 = 1;
      local_964 = 1;
      local_966 = 1;
      local_968 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_978 = vpinsrw_avx(auVar1,1,7);
      local_428 = local_aa8[0];
      lStack_420 = local_aa8[1];
      local_438 = local_978._0_8_;
      uStack_430 = local_978._8_8_;
      local_658 = vpand_avx(auVar2,local_978);
      local_648 = local_be8._0_8_;
      uStack_640 = local_be8._8_8_;
      local_be8 = vpaddw_avx(local_be8,local_658);
      local_128 = local_aa8[0];
      lStack_120 = local_aa8[1];
      local_12c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a04 = 1;
      local_93a = 1;
      local_93c = 1;
      local_93e = 1;
      local_940 = 1;
      local_942 = 1;
      local_944 = 1;
      local_946 = 1;
      local_948 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_958 = vpinsrw_avx(auVar1,1,7);
      local_448 = local_aa8[0];
      lStack_440 = local_aa8[1];
      local_458 = local_958._0_8_;
      uStack_450 = local_958._8_8_;
      local_678 = vpand_avx(auVar2,local_958);
      local_668 = local_bd8._0_8_;
      uStack_660 = local_bd8._8_8_;
      local_bd8 = vpaddw_avx(local_bd8,local_678);
      local_148 = local_aa8[0];
      lStack_140 = local_aa8[1];
      local_14c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a06 = 1;
      local_91a = 1;
      local_91c = 1;
      local_91e = 1;
      local_920 = 1;
      local_922 = 1;
      local_924 = 1;
      local_926 = 1;
      local_928 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_938 = vpinsrw_avx(auVar1,1,7);
      local_468 = local_aa8[0];
      lStack_460 = local_aa8[1];
      local_478 = local_938._0_8_;
      uStack_470 = local_938._8_8_;
      local_698 = vpand_avx(auVar2,local_938);
      local_688 = local_bc8._0_8_;
      uStack_680 = local_bc8._8_8_;
      local_bc8 = vpaddw_avx(local_bc8,local_698);
      local_168 = local_aa8[0];
      lStack_160 = local_aa8[1];
      local_16c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a08 = 1;
      local_8fa = 1;
      local_8fc = 1;
      local_8fe = 1;
      local_900 = 1;
      local_902 = 1;
      local_904 = 1;
      local_906 = 1;
      local_908 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_918 = vpinsrw_avx(auVar1,1,7);
      local_488 = local_aa8[0];
      lStack_480 = local_aa8[1];
      local_498 = local_918._0_8_;
      uStack_490 = local_918._8_8_;
      local_6b8 = vpand_avx(auVar2,local_918);
      local_6a8 = local_bb8._0_8_;
      uStack_6a0 = local_bb8._8_8_;
      local_bb8 = vpaddw_avx(local_bb8,local_6b8);
      local_188 = local_aa8[0];
      lStack_180 = local_aa8[1];
      local_18c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a0a = 1;
      local_8da = 1;
      local_8dc = 1;
      local_8de = 1;
      local_8e0 = 1;
      local_8e2 = 1;
      local_8e4 = 1;
      local_8e6 = 1;
      local_8e8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_8f8 = vpinsrw_avx(auVar1,1,7);
      local_4a8 = local_aa8[0];
      lStack_4a0 = local_aa8[1];
      local_4b8 = local_8f8._0_8_;
      uStack_4b0 = local_8f8._8_8_;
      local_6d8 = vpand_avx(auVar2,local_8f8);
      local_6c8 = local_ba8._0_8_;
      uStack_6c0 = local_ba8._8_8_;
      local_ba8 = vpaddw_avx(local_ba8,local_6d8);
      local_1a8 = local_aa8[0];
      lStack_1a0 = local_aa8[1];
      local_1ac = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a0c = 1;
      local_8ba = 1;
      local_8bc = 1;
      local_8be = 1;
      local_8c0 = 1;
      local_8c2 = 1;
      local_8c4 = 1;
      local_8c6 = 1;
      local_8c8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_8d8 = vpinsrw_avx(auVar1,1,7);
      local_4c8 = local_aa8[0];
      lStack_4c0 = local_aa8[1];
      local_4d8 = local_8d8._0_8_;
      uStack_4d0 = local_8d8._8_8_;
      local_6f8 = vpand_avx(auVar2,local_8d8);
      local_6e8 = local_b98._0_8_;
      uStack_6e0 = local_b98._8_8_;
      local_b98 = vpaddw_avx(local_b98,local_6f8);
      local_1c8 = local_aa8[0];
      lStack_1c0 = local_aa8[1];
      local_1cc = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a0e = 1;
      local_89a = 1;
      local_89c = 1;
      local_89e = 1;
      local_8a0 = 1;
      local_8a2 = 1;
      local_8a4 = 1;
      local_8a6 = 1;
      local_8a8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_8b8 = vpinsrw_avx(auVar1,1,7);
      local_4e8 = local_aa8[0];
      lStack_4e0 = local_aa8[1];
      local_4f8 = local_8b8._0_8_;
      uStack_4f0 = local_8b8._8_8_;
      local_718 = vpand_avx(auVar2,local_8b8);
      local_708 = local_b88._0_8_;
      uStack_700 = local_b88._8_8_;
      local_b88 = vpaddw_avx(local_b88,local_718);
      local_1e8 = local_aa8[0];
      lStack_1e0 = local_aa8[1];
      local_1ec = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a10 = 1;
      local_87a = 1;
      local_87c = 1;
      local_87e = 1;
      local_880 = 1;
      local_882 = 1;
      local_884 = 1;
      local_886 = 1;
      local_888 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_898 = vpinsrw_avx(auVar1,1,7);
      local_508 = local_aa8[0];
      lStack_500 = local_aa8[1];
      local_518 = local_898._0_8_;
      uStack_510 = local_898._8_8_;
      local_738 = vpand_avx(auVar2,local_898);
      local_728 = local_b78._0_8_;
      uStack_720 = local_b78._8_8_;
      local_b78 = vpaddw_avx(local_b78,local_738);
      local_208 = local_aa8[0];
      lStack_200 = local_aa8[1];
      local_20c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a12 = 1;
      local_85a = 1;
      local_85c = 1;
      local_85e = 1;
      local_860 = 1;
      local_862 = 1;
      local_864 = 1;
      local_866 = 1;
      local_868 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_878 = vpinsrw_avx(auVar1,1,7);
      local_528 = local_aa8[0];
      lStack_520 = local_aa8[1];
      local_538 = local_878._0_8_;
      uStack_530 = local_878._8_8_;
      local_758 = vpand_avx(auVar2,local_878);
      local_748 = local_b68._0_8_;
      uStack_740 = local_b68._8_8_;
      local_b68 = vpaddw_avx(local_b68,local_758);
      local_228 = local_aa8[0];
      lStack_220 = local_aa8[1];
      local_22c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a14 = 1;
      local_83a = 1;
      local_83c = 1;
      local_83e = 1;
      local_840 = 1;
      local_842 = 1;
      local_844 = 1;
      local_846 = 1;
      local_848 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_858 = vpinsrw_avx(auVar1,1,7);
      local_548 = local_aa8[0];
      lStack_540 = local_aa8[1];
      local_558 = local_858._0_8_;
      uStack_550 = local_858._8_8_;
      local_778 = vpand_avx(auVar2,local_858);
      local_768 = local_b58._0_8_;
      uStack_760 = local_b58._8_8_;
      local_b58 = vpaddw_avx(local_b58,local_778);
      local_248 = local_aa8[0];
      lStack_240 = local_aa8[1];
      local_24c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a16 = 1;
      local_81a = 1;
      local_81c = 1;
      local_81e = 1;
      local_820 = 1;
      local_822 = 1;
      local_824 = 1;
      local_826 = 1;
      local_828 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_838 = vpinsrw_avx(auVar1,1,7);
      local_568 = local_aa8[0];
      lStack_560 = local_aa8[1];
      local_578 = local_838._0_8_;
      uStack_570 = local_838._8_8_;
      local_798 = vpand_avx(auVar2,local_838);
      local_788 = local_b48._0_8_;
      uStack_780 = local_b48._8_8_;
      local_b48 = vpaddw_avx(local_b48,local_798);
      local_268 = local_aa8[0];
      lStack_260 = local_aa8[1];
      local_26c = 1;
      auVar2 = vpsrlw_avx(auVar2,ZEXT416(1));
      local_aa8[0] = auVar2._0_8_;
      local_aa8[1] = auVar2._8_8_;
      local_a18 = 1;
      local_7fa = 1;
      local_7fc = 1;
      local_7fe = 1;
      local_800 = 1;
      local_802 = 1;
      local_804 = 1;
      local_806 = 1;
      local_808 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_818 = vpinsrw_avx(auVar1,1,7);
      local_588 = local_aa8[0];
      lStack_580 = local_aa8[1];
      local_598 = local_818._0_8_;
      uStack_590 = local_818._8_8_;
      local_7b8 = vpand_avx(auVar2,local_818);
      local_7a8 = local_b38._0_8_;
      uStack_7a0 = local_b38._8_8_;
      local_b38 = vpaddw_avx(local_b38,local_7b8);
      local_288 = local_aa8[0];
      lStack_280 = local_aa8[1];
      local_28c = 1;
      local_aa8 = (__m128i)vpsrlw_avx(auVar2,ZEXT416(1));
      b_13[1] = b_10[1];
      b_13[0] = extraout_RDX_12;
      c_13[1] = in_R9;
      c_13[0] = in_R8;
      pospopcnt_csa_sse(&local_aa8,&local_a98,b_13,c_13);
      uVar4 = extraout_RDX_13;
    }
    for (local_c40 = 0; local_c40 < 0x10; local_c40 = local_c40 + 1) {
      local_7c8 = *(undefined8 *)(local_c28 + local_c40 * 0x10);
      uStack_7c0 = *(undefined8 *)(local_c28 + local_c40 * 0x10 + 8);
      local_a1a = 1;
      local_7da = 1;
      local_7dc = 1;
      local_7de = 1;
      local_7e0 = 1;
      local_7e2 = 1;
      local_7e4 = 1;
      local_7e6 = 1;
      local_7e8 = 1;
      auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar1 = vpinsrw_avx(auVar1,1,2);
      auVar1 = vpinsrw_avx(auVar1,1,3);
      auVar1 = vpinsrw_avx(auVar1,1,4);
      auVar1 = vpinsrw_avx(auVar1,1,5);
      auVar1 = vpinsrw_avx(auVar1,1,6);
      local_7f8 = vpinsrw_avx(auVar1,1,7);
      local_5a8 = local_aa8[0];
      lStack_5a0 = local_aa8[1];
      local_5b8 = local_7f8._0_8_;
      uStack_5b0 = local_7f8._8_8_;
      local_7d8 = vpand_avx((undefined1  [16])local_aa8,local_7f8);
      auVar1._8_8_ = uStack_7c0;
      auVar1._0_8_ = local_7c8;
      auVar1 = vpaddw_avx(auVar1,local_7d8);
      *(undefined1 (*) [16])(local_c28 + local_c40 * 0x10) = auVar1;
      local_2a8 = local_aa8[0];
      lStack_2a0 = local_aa8[1];
      local_2ac = 1;
      local_aa8 = (__m128i)vpsrlw_avx((undefined1  [16])local_aa8,ZEXT416(1));
    }
    for (local_c48 = 0; local_c48 < 0x10; local_c48 = local_c48 + 1) {
      local_8 = local_b28;
      uVar4 = local_c48 * 0x10;
      local_18 = *(undefined8 *)(local_c28 + uVar4);
      uStack_10 = *(undefined8 *)(local_c28 + uVar4 + 8);
      local_b28[0] = local_18;
      local_b28[1] = uStack_10;
      for (local_c50 = 0; local_c50 < 8; local_c50 = local_c50 + 1) {
        uVar3 = (uint)*(ushort *)((long)local_b28 + local_c50 * 2) * 0x10 +
                *(int *)(local_a38 + local_c48 * 4);
        uVar4 = (ulong)uVar3;
        *(uint *)(local_a38 + local_c48 * 4) = uVar3;
      }
    }
  }
  local_b28[1] = lStack_a60;
  local_b28[0] = local_a68;
  for (local_c58 = 0; local_c58 < 8; local_c58 = local_c58 + 1) {
    for (local_c5c = 0; local_c5c < 0x10; local_c5c = local_c5c + 1) {
      *(int *)(local_a38 + (long)local_c5c * 4) =
           ((int)((uint)*(ushort *)((long)local_b28 + local_c58 * 2) & 1 << ((byte)local_c5c & 0x1f)
                 ) >> ((byte)local_c5c & 0x1f)) + *(int *)(local_a38 + (long)local_c5c * 4);
    }
  }
  local_b28[1] = lStack_a70;
  local_b28[0] = local_a78;
  for (local_c68 = 0; local_c68 < 8; local_c68 = local_c68 + 1) {
    for (local_c6c = 0; local_c6c < 0x10; local_c6c = local_c6c + 1) {
      *(int *)(local_a38 + (long)local_c6c * 4) =
           ((int)((uint)*(ushort *)((long)local_b28 + local_c68 * 2) & 1 << ((byte)local_c6c & 0x1f)
                 ) >> ((byte)local_c6c & 0x1f)) * 2 + *(int *)(local_a38 + (long)local_c6c * 4);
    }
  }
  local_b28[1] = lStack_a80;
  local_b28[0] = local_a88;
  for (local_c78 = 0; local_c78 < 8; local_c78 = local_c78 + 1) {
    for (local_c7c = 0; local_c7c < 0x10; local_c7c = local_c7c + 1) {
      *(int *)(local_a38 + (long)local_c7c * 4) =
           ((int)((uint)*(ushort *)((long)local_b28 + local_c78 * 2) & 1 << ((byte)local_c7c & 0x1f)
                 ) >> ((byte)local_c7c & 0x1f)) * 4 + *(int *)(local_a38 + (long)local_c7c * 4);
    }
  }
  local_b28[0] = local_a98[0];
  local_b28[1] = local_a98[1];
  for (local_c88 = 0; local_c88 < 8; local_c88 = local_c88 + 1) {
    for (local_c8c = 0; local_c8c < 0x10; local_c8c = local_c8c + 1) {
      *(int *)(local_a38 + (long)local_c8c * 4) =
           ((int)((uint)*(ushort *)((long)local_b28 + local_c88 * 2) & 1 << ((byte)local_c8c & 0x1f)
                 ) >> ((byte)local_c8c & 0x1f)) * 8 + *(int *)(local_a38 + (long)local_c8c * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[16];

    while (i < limit) {        
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm_add_epi16(counter[pos], _mm_and_si128(v16, _mm_set1_epi16(1))); \
    v16 = _mm_srli_epi16(v16, 1); \
}
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
#undef U
        }

        // update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_add_epi16(counter[i], _mm_and_si128(v16, _mm_set1_epi16(1)));
            v16 = _mm_srli_epi16(v16, 1);
        }
        
        for (size_t i = 0; i < 16; ++i) {
            _mm_storeu_si128((__m128i*)buffer, counter[i]);
            for (size_t z = 0; z < 8; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}